

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int x86PUSH(uchar *stream,int num)

{
  if ((char)(uchar)num == num) {
    *stream = 'j';
    stream[1] = (uchar)num;
    return 2;
  }
  *stream = 'h';
  *(int *)(stream + 1) = num;
  return 5;
}

Assistant:

int x86PUSH(unsigned char *stream, int num)
{
	unsigned char *start = stream;

	if((char)(num) == num)
	{
		*stream++ = 0x6a;
		stream += encodeImmByte(stream, (char)num);

		return int(stream - start);
	}

	*stream++ = 0x68;
	stream += encodeImmDword(stream, num);

	return int(stream - start);
}